

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluStrUtil.cpp
# Opt level: O0

ostream * eglu::operator<<(ostream *str,SurfaceAttribValueFmt *attribFmt)

{
  Hex<8UL> hex;
  Enum<int,_2UL> EVar1;
  Enum<int,_2UL> local_110;
  GetNameFunc local_100;
  int local_f8;
  Enum<int,_2UL> local_f0;
  GetNameFunc local_e0;
  int local_d8;
  Enum<int,_2UL> local_d0;
  GetNameFunc local_c0;
  int local_b8;
  Enum<int,_2UL> local_b0;
  GetNameFunc local_a0;
  int local_98;
  Enum<int,_2UL> local_90;
  GetNameFunc local_80;
  int local_78;
  Enum<int,_2UL> local_70;
  GetNameFunc local_60;
  int local_58;
  Enum<int,_2UL> local_50;
  GetNameFunc local_40;
  int local_38;
  Enum<int,_2UL> local_30;
  SurfaceAttribValueFmt *local_20;
  SurfaceAttribValueFmt *attribFmt_local;
  ostream *str_local;
  
  local_20 = attribFmt;
  attribFmt_local = (SurfaceAttribValueFmt *)str;
  switch(attribFmt->attribute) {
  case 0x3028:
  case 0x3056:
  case 0x3057:
  case 0x3090:
  case 0x3091:
  case 0x3092:
    str_local = (ostream *)std::ostream::operator<<(str,attribFmt->value);
    break;
  default:
    hex = tcu::toHex<int>(attribFmt->value);
    str_local = tcu::Format::operator<<(str,hex);
    break;
  case 0x3058:
  case 0x3082:
    EVar1 = getBoolDontCareStr(attribFmt->value);
    local_40 = EVar1.m_getName;
    local_38 = EVar1.m_value;
    local_30.m_getName = local_40;
    local_30.m_value = local_38;
    str_local = tcu::Format::operator<<(str,&local_30);
    break;
  case 0x3080:
    EVar1 = getTextureFormatStr(attribFmt->value);
    local_c0 = EVar1.m_getName;
    local_b8 = EVar1.m_value;
    local_b0.m_getName = local_c0;
    local_b0.m_value = local_b8;
    str_local = tcu::Format::operator<<(str,&local_b0);
    break;
  case 0x3081:
    EVar1 = getTextureTargetStr(attribFmt->value);
    local_e0 = EVar1.m_getName;
    local_d8 = EVar1.m_value;
    local_d0.m_getName = local_e0;
    local_d0.m_value = local_d8;
    str_local = tcu::Format::operator<<(str,&local_d0);
    break;
  case 0x3086:
    EVar1 = getRenderBufferStr(attribFmt->value);
    local_80 = EVar1.m_getName;
    local_78 = EVar1.m_value;
    local_70.m_getName = local_80;
    local_70.m_value = local_78;
    str_local = tcu::Format::operator<<(str,&local_70);
    break;
  case 0x3087:
    EVar1 = getColorspaceStr(attribFmt->value);
    local_110.m_getName = EVar1.m_getName;
    local_110.m_value = EVar1.m_value;
    str_local = tcu::Format::operator<<(str,&local_110);
    break;
  case 0x3088:
    EVar1 = getAlphaFormatStr(attribFmt->value);
    local_100 = EVar1.m_getName;
    local_f8 = EVar1.m_value;
    local_f0.m_getName = local_100;
    local_f0.m_value = local_f8;
    str_local = tcu::Format::operator<<(str,&local_f0);
    break;
  case 0x3093:
    EVar1 = getSwapBehaviorStr(attribFmt->value);
    local_a0 = EVar1.m_getName;
    local_98 = EVar1.m_value;
    local_90.m_getName = local_a0;
    local_90.m_value = local_98;
    str_local = tcu::Format::operator<<(str,&local_90);
    break;
  case 0x3099:
    EVar1 = getMultisampleResolveStr(attribFmt->value);
    local_60 = EVar1.m_getName;
    local_58 = EVar1.m_value;
    local_50.m_getName = local_60;
    local_50.m_value = local_58;
    str_local = tcu::Format::operator<<(str,&local_50);
  }
  return str_local;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const SurfaceAttribValueFmt& attribFmt)
{
	switch (attribFmt.attribute)
	{
		case EGL_CONFIG_ID:
		case EGL_WIDTH:
		case EGL_HEIGHT:
		case EGL_HORIZONTAL_RESOLUTION:
		case EGL_VERTICAL_RESOLUTION:
		case EGL_PIXEL_ASPECT_RATIO:
			return str << (int)attribFmt.value;

		case EGL_LARGEST_PBUFFER:
		case EGL_MIPMAP_TEXTURE:
			return str << getBoolDontCareStr(attribFmt.value);

		case EGL_MULTISAMPLE_RESOLVE:
			return str << getMultisampleResolveStr(attribFmt.value);

		case EGL_RENDER_BUFFER:
			return str << getRenderBufferStr(attribFmt.value);

		case EGL_SWAP_BEHAVIOR:
			return str << getSwapBehaviorStr(attribFmt.value);

		case EGL_TEXTURE_FORMAT:
			return str << getTextureFormatStr(attribFmt.value);

		case EGL_TEXTURE_TARGET:
			return str << getTextureTargetStr(attribFmt.value);

		case EGL_ALPHA_FORMAT:
			return str << getAlphaFormatStr(attribFmt.value);

		case EGL_COLORSPACE:
			return str << getColorspaceStr(attribFmt.value);

		default:
			return str << tcu::toHex(attribFmt.value);
	}
}